

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O1

void cfl_subsample_lbd_422_32x8_ssse3(uint8_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  __m128i *pred_buf_m128i;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  
  auVar1 = _DAT_0050d900;
  pauVar3 = (undefined1 (*) [16])(cfl_type + 0x10);
  uVar2 = 0xffffffffffffffc0;
  do {
    auVar4 = pmaddubsw(pauVar3[-1],auVar1);
    *(undefined1 (*) [16])((long)output_q3 + uVar2 + 0x40) = auVar4;
    auVar4 = pmaddubsw(*pauVar3,auVar1);
    *(undefined1 (*) [16])((long)output_q3 + uVar2 + 0x50) = auVar4;
    uVar2 = uVar2 + 0x40;
    pauVar3 = (undefined1 (*) [16])(*pauVar3 + input_stride);
  } while (uVar2 < 0x1c0);
  return;
}

Assistant:

CFL_GET_SUBSAMPLE_FUNCTION(ssse3)

static inline __m128i predict_unclipped(const __m128i *input, __m128i alpha_q12,
                                        __m128i alpha_sign, __m128i dc_q0) {
  __m128i ac_q3 = _mm_loadu_si128(input);
  __m128i ac_sign = _mm_sign_epi16(alpha_sign, ac_q3);
  __m128i scaled_luma_q0 = _mm_mulhrs_epi16(_mm_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm_add_epi16(scaled_luma_q0, dc_q0);
}